

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O3

int __thiscall ncnn::RNN::forward(RNN *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _h;
  int iVar1;
  int *piVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  void *__src;
  void *__dest;
  Mat m_2;
  Mat m_8;
  Mat m_7;
  Mat m_1;
  Mat m;
  Mat local_78;
  
  _h = bottom_blob->h;
  iVar1 = this->direction;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,this->num_output,4,opt->workspace_allocator);
  iVar5 = -100;
  if (local_78.data == (void *)0x0) goto LAB_0036854a;
  if (local_78.cstep * (long)local_78.c == 0) goto LAB_0036854a;
  uVar4 = (int)local_78.cstep * local_78.c;
  if (0 < (int)uVar4) {
    memset(local_78.data,0,(ulong)uVar4 << 2);
  }
  Mat::create(top_blob,this->num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_0036854a;
  uVar4 = this->direction;
  if (uVar4 < 2) {
    if (this->int8_scale_term == 0) {
      m.w = (this->weight_xc_data).w;
      m.h = (this->weight_xc_data).h;
      m.data = (this->weight_xc_data).data;
      uVar6 = (this->weight_xc_data).elemsize;
      m.elempack = (this->weight_xc_data).elempack;
      m.allocator = (this->weight_xc_data).allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar6;
      m.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
      m.c = (this->weight_xc_data).d;
      m.d = 1;
      iVar1 = (this->weight_xc_data).dims;
      m.dims = iVar1 + -1;
      m.cstep = (uVar6 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar6;
      if (iVar1 == 4) {
        m.cstep = (long)m.h * (long)m.w;
      }
      m_1.w = (this->bias_c_data).w;
      m_1.h = (this->bias_c_data).h;
      m_1.data = (this->bias_c_data).data;
      uVar6 = (this->bias_c_data).elemsize;
      m_1.elempack = (this->bias_c_data).elempack;
      m_1.allocator = (this->bias_c_data).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar6;
      m_1.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
      m_1.c = (this->bias_c_data).d;
      m_1.d = 1;
      iVar1 = (this->bias_c_data).dims;
      m_1.dims = iVar1 + -1;
      m_1.cstep = (uVar6 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar6;
      if (iVar1 == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = (this->weight_hc_data).w;
      m_2.h = (this->weight_hc_data).h;
      m_2.c = (this->weight_hc_data).d;
      m_2.data = (this->weight_hc_data).data;
      m_2.elemsize = (this->weight_hc_data).elemsize;
      m_2.elempack = (this->weight_hc_data).elempack;
      m_2.allocator = (this->weight_hc_data).allocator;
      m_2.refcount = (int *)0x0;
      m_2.d = 1;
      iVar1 = (this->weight_hc_data).dims;
      m_2.dims = iVar1 + -1;
      m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                  m_2.elemsize;
      if (iVar1 == 4) {
        m_2.cstep = (long)m_2.h * (long)m_2.w;
      }
      iVar5 = rnn(bottom_blob,top_blob,uVar4,&m,&m_1,&m_2,&local_78,
                  (Option *)opt->workspace_allocator);
    }
    else {
      m.w = (this->weight_xc_data).w;
      m.h = (this->weight_xc_data).h;
      m.data = (this->weight_xc_data).data;
      uVar6 = (this->weight_xc_data).elemsize;
      m.elempack = (this->weight_xc_data).elempack;
      m.allocator = (this->weight_xc_data).allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar6;
      m.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
      m.c = (this->weight_xc_data).d;
      m.d = 1;
      iVar1 = (this->weight_xc_data).dims;
      m.dims = iVar1 + -1;
      m.cstep = (uVar6 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar6;
      if (iVar1 == 4) {
        m.cstep = (long)m.h * (long)m.w;
      }
      m_1.w = (this->bias_c_data).w;
      m_1.h = (this->bias_c_data).h;
      m_1.data = (this->bias_c_data).data;
      uVar6 = (this->bias_c_data).elemsize;
      m_1.elempack = (this->bias_c_data).elempack;
      m_1.allocator = (this->bias_c_data).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar6;
      m_1.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
      m_1.c = (this->bias_c_data).d;
      m_1.d = 1;
      iVar1 = (this->bias_c_data).dims;
      m_1.dims = iVar1 + -1;
      m_1.cstep = (uVar6 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar6;
      if (iVar1 == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = (this->weight_hc_data).w;
      m_2.h = (this->weight_hc_data).h;
      m_2.c = (this->weight_hc_data).d;
      m_2.data = (this->weight_hc_data).data;
      m_2.elemsize = (this->weight_hc_data).elemsize;
      m_2.elempack = (this->weight_hc_data).elempack;
      m_2.allocator = (this->weight_hc_data).allocator;
      m_2.refcount = (int *)0x0;
      m_2.d = 1;
      iVar1 = (this->weight_hc_data).dims;
      m_2.dims = iVar1 + -1;
      m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                  m_2.elemsize;
      if (iVar1 == 4) {
        m_2.cstep = (long)m_2.h * (long)m_2.w;
      }
      iVar5 = rnn_int8(bottom_blob,top_blob,uVar4,&m,
                       (float *)(this->weight_xc_data_int8_scales).data,&m_1,&m_2,
                       (float *)(this->weight_hc_data_int8_scales).data,&local_78,opt);
    }
    if (iVar5 != 0) goto LAB_0036854a;
    uVar4 = this->direction;
  }
  if (uVar4 == 2) {
    m.cstep = 0;
    m.data = (void *)0x0;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = 0;
    m.elemsize._4_4_ = 0;
    m.elempack = 0;
    m.allocator = (Allocator *)0x0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
    Mat::create(&m,this->num_output,_h,4,opt->workspace_allocator);
    iVar5 = -100;
    if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
      bVar3 = false;
    }
    else {
      m_1.cstep = 0;
      m_1.data = (void *)0x0;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = 0;
      m_1.elemsize._4_4_ = 0;
      m_1.elempack = 0;
      m_1.allocator = (Allocator *)0x0;
      m_1.dims = 0;
      m_1.w = 0;
      m_1.h = 0;
      m_1.d = 0;
      m_1.c = 0;
      Mat::create(&m_1,this->num_output,_h,4,opt->workspace_allocator);
      iVar5 = -100;
      if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
LAB_00368cfa:
        bVar3 = false;
      }
      else {
        if (this->int8_scale_term == 0) {
          m_2.w = (this->weight_xc_data).w;
          m_2.h = (this->weight_xc_data).h;
          m_2.c = (this->weight_xc_data).d;
          m_2.data = (this->weight_xc_data).data;
          m_2.elemsize = (this->weight_xc_data).elemsize;
          m_2.elempack = (this->weight_xc_data).elempack;
          m_2.allocator = (this->weight_xc_data).allocator;
          m_2.refcount = (int *)0x0;
          m_2.d = 1;
          iVar1 = (this->weight_xc_data).dims;
          m_2.dims = iVar1 + -1;
          m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                      m_2.elemsize;
          if (iVar1 == 4) {
            m_2.cstep = (long)m_2.h * (long)m_2.w;
          }
          m_7.w = (this->bias_c_data).w;
          m_7.h = (this->bias_c_data).h;
          m_7.c = (this->bias_c_data).d;
          m_7.data = (this->bias_c_data).data;
          m_7.elemsize = (this->bias_c_data).elemsize;
          m_7.elempack = (this->bias_c_data).elempack;
          m_7.allocator = (this->bias_c_data).allocator;
          m_7.refcount = (int *)0x0;
          m_7.d = 1;
          iVar1 = (this->bias_c_data).dims;
          m_7.dims = iVar1 + -1;
          m_7.cstep = (m_7.elemsize * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) /
                      m_7.elemsize;
          if (iVar1 == 4) {
            m_7.cstep = (long)m_7.h * (long)m_7.w;
          }
          m_8.w = (this->weight_hc_data).w;
          m_8.h = (this->weight_hc_data).h;
          m_8.c = (this->weight_hc_data).d;
          m_8.data = (this->weight_hc_data).data;
          m_8.elemsize = (this->weight_hc_data).elemsize;
          m_8.elempack = (this->weight_hc_data).elempack;
          m_8.allocator = (this->weight_hc_data).allocator;
          m_8.refcount = (int *)0x0;
          m_8.d = 1;
          iVar1 = (this->weight_hc_data).dims;
          m_8.dims = iVar1 + -1;
          m_8.cstep = (m_8.elemsize * (long)m_8.h * (long)m_8.w + 0xf & 0xfffffffffffffff0) /
                      m_8.elemsize;
          if (iVar1 == 4) {
            m_8.cstep = (long)m_8.h * (long)m_8.w;
          }
          iVar5 = rnn(bottom_blob,&m,0,&m_2,&m_7,&m_8,&local_78,(Option *)opt->workspace_allocator);
        }
        else {
          m_2.w = (this->weight_xc_data).w;
          m_2.h = (this->weight_xc_data).h;
          m_2.c = (this->weight_xc_data).d;
          m_2.data = (this->weight_xc_data).data;
          m_2.elemsize = (this->weight_xc_data).elemsize;
          m_2.elempack = (this->weight_xc_data).elempack;
          m_2.allocator = (this->weight_xc_data).allocator;
          m_2.refcount = (int *)0x0;
          m_2.d = 1;
          iVar1 = (this->weight_xc_data).dims;
          m_2.dims = iVar1 + -1;
          m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                      m_2.elemsize;
          if (iVar1 == 4) {
            m_2.cstep = (long)m_2.h * (long)m_2.w;
          }
          m_7.w = (this->bias_c_data).w;
          m_7.h = (this->bias_c_data).h;
          m_7.c = (this->bias_c_data).d;
          m_7.data = (this->bias_c_data).data;
          m_7.elemsize = (this->bias_c_data).elemsize;
          m_7.elempack = (this->bias_c_data).elempack;
          m_7.allocator = (this->bias_c_data).allocator;
          m_7.refcount = (int *)0x0;
          m_7.d = 1;
          iVar1 = (this->bias_c_data).dims;
          m_7.dims = iVar1 + -1;
          m_7.cstep = (m_7.elemsize * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) /
                      m_7.elemsize;
          if (iVar1 == 4) {
            m_7.cstep = (long)m_7.h * (long)m_7.w;
          }
          m_8.w = (this->weight_hc_data).w;
          m_8.h = (this->weight_hc_data).h;
          m_8.c = (this->weight_hc_data).d;
          m_8.data = (this->weight_hc_data).data;
          m_8.elemsize = (this->weight_hc_data).elemsize;
          m_8.elempack = (this->weight_hc_data).elempack;
          m_8.allocator = (this->weight_hc_data).allocator;
          m_8.refcount = (int *)0x0;
          m_8.d = 1;
          iVar1 = (this->weight_hc_data).dims;
          m_8.dims = iVar1 + -1;
          m_8.cstep = (m_8.elemsize * (long)m_8.h * (long)m_8.w + 0xf & 0xfffffffffffffff0) /
                      m_8.elemsize;
          if (iVar1 == 4) {
            m_8.cstep = (long)m_8.h * (long)m_8.w;
          }
          iVar5 = rnn_int8(bottom_blob,&m,0,&m_2,(float *)(this->weight_xc_data_int8_scales).data,
                           &m_7,&m_8,(float *)(this->weight_hc_data_int8_scales).data,&local_78,opt)
          ;
        }
        if (iVar5 != 0) goto LAB_00368cfa;
        if (0 < local_78.c * (int)local_78.cstep) {
          memset(local_78.data,0,(ulong)(uint)(local_78.c * (int)local_78.cstep) << 2);
        }
        if (this->int8_scale_term == 0) {
          m_2.w = (this->weight_xc_data).w;
          m_2.h = (this->weight_xc_data).h;
          m_2.c = (this->weight_xc_data).d;
          m_2.elemsize = (this->weight_xc_data).elemsize;
          m_2.data = (void *)((this->weight_xc_data).cstep * m_2.elemsize +
                             (long)(this->weight_xc_data).data);
          m_2.elempack = (this->weight_xc_data).elempack;
          m_2.allocator = (this->weight_xc_data).allocator;
          m_2.refcount = (int *)0x0;
          m_2.d = 1;
          iVar1 = (this->weight_xc_data).dims;
          m_2.dims = iVar1 + -1;
          m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                      m_2.elemsize;
          if (iVar1 == 4) {
            m_2.cstep = (long)m_2.h * (long)m_2.w;
          }
          m_7.w = (this->bias_c_data).w;
          m_7.h = (this->bias_c_data).h;
          m_7.c = (this->bias_c_data).d;
          m_7.elemsize = (this->bias_c_data).elemsize;
          m_7.data = (void *)((this->bias_c_data).cstep * m_7.elemsize +
                             (long)(this->bias_c_data).data);
          m_7.elempack = (this->bias_c_data).elempack;
          m_7.allocator = (this->bias_c_data).allocator;
          m_7.refcount = (int *)0x0;
          m_7.d = 1;
          iVar1 = (this->bias_c_data).dims;
          m_7.dims = iVar1 + -1;
          m_7.cstep = (m_7.elemsize * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) /
                      m_7.elemsize;
          if (iVar1 == 4) {
            m_7.cstep = (long)m_7.h * (long)m_7.w;
          }
          m_8.w = (this->weight_hc_data).w;
          m_8.h = (this->weight_hc_data).h;
          m_8.c = (this->weight_hc_data).d;
          m_8.elemsize = (this->weight_hc_data).elemsize;
          m_8.data = (void *)((this->weight_hc_data).cstep * m_8.elemsize +
                             (long)(this->weight_hc_data).data);
          m_8.elempack = (this->weight_hc_data).elempack;
          m_8.allocator = (this->weight_hc_data).allocator;
          m_8.refcount = (int *)0x0;
          m_8.d = 1;
          iVar1 = (this->weight_hc_data).dims;
          m_8.dims = iVar1 + -1;
          m_8.cstep = (m_8.elemsize * (long)m_8.h * (long)m_8.w + 0xf & 0xfffffffffffffff0) /
                      m_8.elemsize;
          if (iVar1 == 4) {
            m_8.cstep = (long)m_8.h * (long)m_8.w;
          }
          iVar5 = rnn(bottom_blob,&m_1,1,&m_2,&m_7,&m_8,&local_78,(Option *)opt->workspace_allocator
                     );
        }
        else {
          m_2.w = (this->weight_xc_data).w;
          m_2.h = (this->weight_xc_data).h;
          m_2.c = (this->weight_xc_data).d;
          m_2.elemsize = (this->weight_xc_data).elemsize;
          m_2.data = (void *)((this->weight_xc_data).cstep * m_2.elemsize +
                             (long)(this->weight_xc_data).data);
          m_2.elempack = (this->weight_xc_data).elempack;
          m_2.allocator = (this->weight_xc_data).allocator;
          m_2.refcount = (int *)0x0;
          m_2.d = 1;
          iVar1 = (this->weight_xc_data).dims;
          m_2.dims = iVar1 + -1;
          m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                      m_2.elemsize;
          if (iVar1 == 4) {
            m_2.cstep = (long)m_2.h * (long)m_2.w;
          }
          m_7.w = (this->bias_c_data).w;
          m_7.h = (this->bias_c_data).h;
          m_7.c = (this->bias_c_data).d;
          m_7.elemsize = (this->bias_c_data).elemsize;
          m_7.data = (void *)((this->bias_c_data).cstep * m_7.elemsize +
                             (long)(this->bias_c_data).data);
          m_7.elempack = (this->bias_c_data).elempack;
          m_7.allocator = (this->bias_c_data).allocator;
          m_7.refcount = (int *)0x0;
          m_7.d = 1;
          iVar1 = (this->bias_c_data).dims;
          m_7.dims = iVar1 + -1;
          m_7.cstep = (m_7.elemsize * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) /
                      m_7.elemsize;
          if (iVar1 == 4) {
            m_7.cstep = (long)m_7.h * (long)m_7.w;
          }
          m_8.w = (this->weight_hc_data).w;
          m_8.h = (this->weight_hc_data).h;
          m_8.c = (this->weight_hc_data).d;
          m_8.elemsize = (this->weight_hc_data).elemsize;
          m_8.data = (void *)((this->weight_hc_data).cstep * m_8.elemsize +
                             (long)(this->weight_hc_data).data);
          m_8.elempack = (this->weight_hc_data).elempack;
          m_8.allocator = (this->weight_hc_data).allocator;
          m_8.refcount = (int *)0x0;
          m_8.d = 1;
          iVar1 = (this->weight_hc_data).dims;
          m_8.dims = iVar1 + -1;
          m_8.cstep = (m_8.elemsize * (long)m_8.h * (long)m_8.w + 0xf & 0xfffffffffffffff0) /
                      m_8.elemsize;
          if (iVar1 == 4) {
            m_8.cstep = (long)m_8.h * (long)m_8.w;
          }
          iVar5 = rnn_int8(bottom_blob,&m_1,1,&m_2,
                           (float *)((long)(this->weight_xc_data_int8_scales).w *
                                     (this->weight_xc_data_int8_scales).elemsize +
                                    (long)(this->weight_xc_data_int8_scales).data),&m_7,&m_8,
                           (float *)((long)(this->weight_hc_data_int8_scales).w *
                                     (this->weight_hc_data_int8_scales).elemsize +
                                    (long)(this->weight_hc_data_int8_scales).data),&local_78,opt);
        }
        if (iVar5 != 0) goto LAB_00368cfa;
        bVar3 = true;
        iVar5 = 0;
        if (0 < (int)_h) {
          uVar6 = 0;
          do {
            __src = (void *)((long)m_1.w * uVar6 *
                             CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) + (long)m_1.data)
            ;
            __dest = (void *)((long)top_blob->w * uVar6 * top_blob->elemsize + (long)top_blob->data)
            ;
            memcpy(__dest,(void *)((long)m.w * uVar6 *
                                   CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) + (long)m.data)
                   ,(long)this->num_output << 2);
            memcpy((void *)((long)this->num_output * 4 + (long)__dest),__src,
                   (long)this->num_output << 2);
            uVar6 = uVar6 + 1;
          } while (_h != uVar6);
          bVar3 = true;
        }
      }
      piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            if (m_1.data != (void *)0x0) {
              free(m_1.data);
            }
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (!bVar3) goto LAB_0036854a;
  }
  iVar5 = 0;
LAB_0036854a:
  piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar5;
}

Assistant:

int RNN::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;
    hidden.fill(0.f);

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = rnn_int8(bottom_blob, top_blob, direction, weight_xc_data.channel(0), weight_xc_data_int8_scales.row(0), bias_c_data.channel(0), weight_hc_data.channel(0), weight_hc_data_int8_scales.row(0), hidden, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = rnn(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, opt);
            if (ret != 0)
                return ret;
        }
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = rnn_int8(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), weight_xc_data_int8_scales.row(0), bias_c_data.channel(0), weight_hc_data.channel(0), weight_hc_data_int8_scales.row(0), hidden, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = rnn(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, opt);
            if (ret != 0)
                return ret;
        }

        hidden.fill(0.0f);

#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = rnn_int8(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), weight_xc_data_int8_scales.row(1), bias_c_data.channel(1), weight_hc_data.channel(1), weight_hc_data_int8_scales.row(1), hidden, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = rnn(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden, opt);
            if (ret != 0)
                return ret;
        }

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}